

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

int NeedWriter(FFSArrayRequest_conflict Req,int i)

{
  FFSVarRec_conflict pFVar1;
  ulong uVar2;
  size_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  pFVar1 = Req->VarRec;
  if (Req->RequestType == Local) {
    if (Req->BlockID < pFVar1->PerWriterBlockStart[i]) {
      bVar7 = false;
    }
    else {
      bVar7 = Req->BlockID <= (pFVar1->PerWriterBlockCount[i] + pFVar1->PerWriterBlockStart[i]) - 1;
    }
  }
  else {
    uVar2 = pFVar1->DimCount;
    bVar8 = uVar2 == 0;
    bVar7 = bVar8;
    if (!bVar8) {
      psVar3 = pFVar1->PerWriterStart[i];
      if (psVar3 != (size_t *)0x0) {
        uVar6 = 1;
        while ((bVar7 = bVar8, Req->Count[uVar6 - 1] != 0 &&
               (pFVar1->PerWriterCounts[i][uVar6 - 1] != 0))) {
          uVar4 = Req->Start[uVar6 - 1];
          uVar5 = psVar3[uVar6 - 1];
          if ((pFVar1->PerWriterCounts[i][uVar6 - 1] + uVar5 <= uVar4 && uVar5 < uVar4) ||
             (Req->Count[uVar6 - 1] + uVar4 <= uVar5)) break;
          bVar8 = uVar2 <= uVar6;
          bVar7 = bVar8;
          if ((uVar2 == uVar6) || (uVar6 = uVar6 + 1, bVar7 = uVar2 == 0, psVar3 == (size_t *)0x0))
          break;
        }
      }
    }
  }
  return (uint)bVar7;
}

Assistant:

static int NeedWriter(FFSArrayRequest Req, int i)
{
    if (Req->RequestType == Local)
    {
        size_t NodeFirst = Req->VarRec->PerWriterBlockStart[i];
        size_t NodeLast = Req->VarRec->PerWriterBlockCount[i] + NodeFirst - 1;
        return (NodeFirst <= Req->BlockID) && (NodeLast >= Req->BlockID);
    }
    // else Global case
    for (int j = 0; j < Req->VarRec->DimCount; j++)
    {
        size_t SelOffset = Req->Start[j];
        size_t SelSize = Req->Count[j];
        size_t RankOffset;
        size_t RankSize;
        if (Req->VarRec->PerWriterStart[i] == NULL)
        /* this writer didn't write */
        {
            return 0;
        }
        RankOffset = Req->VarRec->PerWriterStart[i][j];
        RankSize = Req->VarRec->PerWriterCounts[i][j];
        if ((SelSize == 0) || (RankSize == 0))
        {
            return 0;
        }
        if ((RankOffset < SelOffset && (RankOffset + RankSize) <= SelOffset) ||
            (RankOffset >= SelOffset + SelSize))
        {
            return 0;
        }
    }
    return 1;
}